

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrapMode.cpp
# Opt level: O2

Function * wasm::generateBinaryFunc(Module *wasm,Binary *curr)

{
  BinaryOp BVar1;
  Type TVar2;
  LocalGet *pLVar3;
  LocalGet *right;
  Binary *ifFalse;
  Const *pCVar4;
  Binary *pBVar5;
  Binary *right_00;
  Unary *condition;
  If *pIVar6;
  ulong in_R8;
  Expression *body;
  Name NVar7;
  initializer_list<wasm::Type> types;
  Signature sig;
  Name name;
  optional<wasm::Type> type;
  optional<wasm::Type> type_00;
  Literal local_108;
  Literal local_f0;
  Literal local_d8;
  Literal local_c0;
  Type local_a8;
  HeapType local_a0;
  Binary *local_98;
  undefined1 local_90 [8];
  Literal minLit;
  Literal zeroLit;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> func;
  Builder local_40;
  Builder builder;
  
  BVar1 = curr->op;
  TVar2.id = (curr->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id;
  builder.wasm._7_1_ = TVar2.id == 3;
  local_98 = curr;
  local_40.wasm = wasm;
  pLVar3 = MixedArena::alloc<wasm::LocalGet>(&wasm->allocator);
  pLVar3->index = 0;
  (pLVar3->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = TVar2.id;
  right = MixedArena::alloc<wasm::LocalGet>(&wasm->allocator);
  right->index = 1;
  (right->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = TVar2.id;
  ifFalse = Builder::makeBinary(&local_40,BVar1,(Expression *)pLVar3,(Expression *)right);
  if (TVar2.id == 3) {
    local_90 = (undefined1  [8])0x8000000000000000;
    minLit.type.id = 0;
    minLit.field_0.func.super_IString.str._M_str = (char *)0x3;
    zeroLit.field_0.func.super_IString.str._M_str = (char *)0x3;
    if (BVar1 != DivSInt64) goto LAB_00b7dcda;
    func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
         (__uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>)0xffffffffffffffff;
    BVar1 = EqInt64;
  }
  else {
    local_90._0_4_ = 0x80000000;
    minLit.type.id = (ulong)minLit.type.id._4_4_ << 0x20;
    minLit.field_0.func.super_IString.str._M_str = (char *)0x2;
    zeroLit.field_0.func.super_IString.str._M_str = (char *)0x2;
    if (BVar1 != DivSInt32) goto LAB_00b7dcda;
    func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl._0_4_ = 0xffffffff;
    BVar1 = EqInt32;
  }
  pLVar3 = MixedArena::alloc<wasm::LocalGet>(&(local_40.wasm)->allocator);
  pLVar3->index = 0;
  (pLVar3->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = TVar2.id;
  Literal::Literal(&local_108,(Literal *)local_90);
  pCVar4 = Builder::makeConst(&local_40,&local_108);
  pBVar5 = Builder::makeBinary(&local_40,BVar1,(Expression *)pLVar3,(Expression *)pCVar4);
  pLVar3 = MixedArena::alloc<wasm::LocalGet>(&(local_40.wasm)->allocator);
  pLVar3->index = 1;
  (pLVar3->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = TVar2.id;
  Literal::Literal(&local_f0,(Literal *)&func);
  pCVar4 = Builder::makeConst(&local_40,&local_f0);
  right_00 = Builder::makeBinary(&local_40,BVar1,(Expression *)pLVar3,(Expression *)pCVar4);
  pBVar5 = Builder::makeBinary(&local_40,AndInt32,(Expression *)pBVar5,(Expression *)right_00);
  Literal::Literal(&local_d8,(Literal *)&minLit.type);
  pCVar4 = Builder::makeConst(&local_40,&local_d8);
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)in_R8;
  ifFalse = (Binary *)
            Builder::makeIf(&local_40,(Expression *)pBVar5,(Expression *)pCVar4,
                            (Expression *)ifFalse,type);
  Literal::~Literal(&local_d8);
  Literal::~Literal(&local_f0);
  Literal::~Literal(&local_108);
  Literal::~Literal((Literal *)&func);
LAB_00b7dcda:
  types._M_len = 2;
  types._M_array = (iterator)&func;
  func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
       (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)TVar2.id;
  Type::Type(&local_a8,types);
  NVar7 = getBinaryFuncName(local_98);
  sig.results.id = TVar2.id;
  sig.params.id = local_a8.id;
  HeapType::HeapType(&local_a0,sig);
  body = (Expression *)&func;
  func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
       (__uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>)0x0;
  name.super_IString.str._M_str = NVar7.super_IString.str._M_len;
  name.super_IString.str._M_len = (size_t)&zeroLit.type;
  Builder::makeFunction
            (name,(HeapType)NVar7.super_IString.str._M_str,
             (vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_a0.id,body);
  std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
            ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)&func);
  pLVar3 = MixedArena::alloc<wasm::LocalGet>(&(local_40.wasm)->allocator);
  pLVar3->index = 1;
  (pLVar3->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = TVar2.id;
  condition = Builder::makeUnary(&local_40,builder.wasm._7_1_ | EqZInt32,(Expression *)pLVar3);
  Literal::Literal(&local_c0,(Literal *)&minLit.type);
  pCVar4 = Builder::makeConst(&local_40,&local_c0);
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)body;
  pIVar6 = Builder::makeIf(&local_40,(Expression *)condition,(Expression *)pCVar4,
                           (Expression *)ifFalse,type_00);
  *(If **)(zeroLit.type.id + 0x60) = pIVar6;
  Literal::~Literal(&local_c0);
  TVar2 = zeroLit.type;
  zeroLit.type.id = 0;
  std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
            ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)&zeroLit.type);
  Literal::~Literal((Literal *)&minLit.type);
  Literal::~Literal((Literal *)local_90);
  return (Function *)TVar2.id;
}

Assistant:

Function* generateBinaryFunc(Module& wasm, Binary* curr) {
  BinaryOp op = curr->op;
  Type type = curr->type;
  bool isI64 = type == Type::i64;
  Builder builder(wasm);
  Expression* result = builder.makeBinary(
    op, builder.makeLocalGet(0, type), builder.makeLocalGet(1, type));
  BinaryOp divSIntOp = isI64 ? DivSInt64 : DivSInt32;
  UnaryOp eqZOp = isI64 ? EqZInt64 : EqZInt32;
  Literal minLit = isI64 ? Literal(std::numeric_limits<int64_t>::min())
                         : Literal(std::numeric_limits<int32_t>::min());
  Literal zeroLit = isI64 ? Literal(int64_t(0)) : Literal(int32_t(0));
  if (op == divSIntOp) {
    // guard against signed division overflow
    BinaryOp eqOp = isI64 ? EqInt64 : EqInt32;
    Literal negLit = isI64 ? Literal(int64_t(-1)) : Literal(int32_t(-1));
    result = builder.makeIf(
      builder.makeBinary(
        AndInt32,
        builder.makeBinary(
          eqOp, builder.makeLocalGet(0, type), builder.makeConst(minLit)),
        builder.makeBinary(
          eqOp, builder.makeLocalGet(1, type), builder.makeConst(negLit))),
      builder.makeConst(zeroLit),
      result);
  }
  auto funcSig = Signature({type, type}, type);
  auto func = Builder::makeFunction(getBinaryFuncName(curr), funcSig, {});
  func->body =
    builder.makeIf(builder.makeUnary(eqZOp, builder.makeLocalGet(1, type)),
                   builder.makeConst(zeroLit),
                   result);
  // TODO: use unique_ptr properly and do not release ownership.
  return func.release();
}